

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass_p.h
# Opt level: O3

Error __thiscall
asmjit::v1_14::RAInstBuilder::add
          (RAInstBuilder *this,RAWorkReg *workReg,RATiedFlags flags,RegMask useRegMask,
          uint32_t useId,uint32_t useRewriteMask,RegMask outRegMask,uint32_t outId,
          uint32_t outRewriteMask,uint32_t rmSize,uint32_t consecutiveParent)

{
  BaseCompiler **ppBVar1;
  Array<unsigned_char,_4UL> *pAVar2;
  int iVar3;
  undefined4 *puVar4;
  FuncNode *pFVar5;
  RABlock *this_00;
  InstControlFlow IVar6;
  char cVar7;
  uint uVar8;
  Error EVar9;
  RABlock *pRVar10;
  RABlock *pRVar11;
  Logger *pLVar12;
  undefined8 extraout_RAX;
  byte bVar13;
  byte bVar15;
  byte bVar16;
  ulong uVar17;
  long lVar18;
  int extraout_EDX;
  int extraout_EDX_00;
  InvokeNode *initialNode;
  uint *puVar19;
  BaseRAPass *pBVar20;
  uint uVar21;
  uint uVar22;
  long lVar23;
  RABlock **ppRVar24;
  uint uVar25;
  InvokeNode *invokeNode;
  uint64_t uVar26;
  float __x;
  InstControlFlow IStack_10f4;
  RABlock **ppRStack_10f0;
  LabelNode *pLStack_10e8;
  long lStack_10e0;
  ulong uStack_10d8;
  long lStack_10c8;
  RABlock *pRStack_10c0;
  undefined4 uStack_10b8;
  undefined8 uStack_10b4;
  undefined8 uStack_10ac;
  undefined8 uStack_10a4;
  undefined8 uStack_109c;
  undefined8 uStack_1094;
  undefined8 uStack_108c;
  undefined4 uStack_1084;
  uint *puStack_1080;
  uint auStack_1078 [3];
  byte abStack_106a [4082];
  ulong uStack_78;
  ulong uStack_70;
  ulong uStack_68;
  undefined8 uStack_60;
  ulong uStack_58;
  code *pcStack_50;
  undefined8 uStack_48;
  code *pcStack_40;
  byte bVar14;
  
  uVar8 = *(uint *)(workReg + 0x20) >> 8 & 0xf;
  lVar18 = *(long *)(workReg + 0x10);
  bVar13 = (byte)(*(uint *)(workReg + 0x20) >> 8);
  bVar14 = (byte)useId;
  bVar16 = (byte)uVar8;
  if (useId != 0xff) {
    *(uint *)(this + 0x14) = *(uint *)(this + 0x14) | 0x100 << (bVar13 & 0xf);
    if (3 < bVar16) {
      pcStack_40 = (code *)0x137813;
      add();
      goto LAB_00137813;
    }
    *(uint *)(this + (ulong)uVar8 * 4 + 0x18) =
         *(uint *)(this + (ulong)uVar8 * 4 + 0x18) | 1 << (bVar14 & 0x1f);
    flags = flags | kUseFixed;
  }
  bVar15 = (byte)outId;
  if (outId != 0xff) {
    if (3 < bVar16) {
LAB_00137813:
      pcStack_40 = (code *)0x137818;
      add();
      return 0x41;
    }
    *(uint *)(this + (ulong)uVar8 * 4 + 0x28) =
         *(uint *)(this + (ulong)uVar8 * 4 + 0x28) | 1 << (bVar15 & 0x1f);
    flags = flags | kOutFixed;
  }
  *(RATiedFlags *)(this + 8) = *(RATiedFlags *)(this + 8) | flags;
  uVar25 = 1 << (bVar13 & 0xf);
  *(uint *)(this + 0x14) = *(uint *)(this + 0x14) | uVar25;
  if (lVar18 != 0) {
    if (*(uint32_t *)(lVar18 + 4) != consecutiveParent) {
      if (*(uint32_t *)(lVar18 + 4) != 0xffffffff) {
        return 3;
      }
      *(uint32_t *)(lVar18 + 4) = consecutiveParent;
    }
    if (useId != 0xff) {
      if (*(char *)(lVar18 + 0xe) != -1) {
        return 0x41;
      }
      *(byte *)(lVar18 + 0xe) = bVar14;
    }
    if (outId != 0xff) {
      if (*(char *)(lVar18 + 0xf) != -1) {
        return 0x41;
      }
      *(byte *)(lVar18 + 0xf) = bVar15;
    }
    *(char *)(lVar18 + 0xc) = *(char *)(lVar18 + 0xc) + '\x01';
    *(RATiedFlags *)(lVar18 + 8) = *(RATiedFlags *)(lVar18 + 8) | flags;
    *(uint *)(lVar18 + 0x10) = *(uint *)(lVar18 + 0x10) & useRegMask;
    *(uint *)(lVar18 + 0x18) = *(uint *)(lVar18 + 0x18) | useRewriteMask;
    *(uint *)(lVar18 + 0x14) = *(uint *)(lVar18 + 0x14) & outRegMask;
    *(uint *)(lVar18 + 0x1c) = *(uint *)(lVar18 + 0x1c) | outRewriteMask;
    bVar16 = (byte)rmSize;
    if (rmSize < *(byte *)(lVar18 + 0xd)) {
      bVar16 = *(byte *)(lVar18 + 0xd);
    }
    *(byte *)(lVar18 + 0xd) = bVar16;
    return 0;
  }
  puVar4 = *(undefined4 **)(this + 0x38);
  if (((long)puVar4 + (-0x40 - (long)this) & 0x1ffffff000U) == 0) {
    *(undefined4 **)(this + 0x38) = puVar4 + 8;
    *puVar4 = *(undefined4 *)workReg;
    puVar4[1] = consecutiveParent;
    puVar4[2] = flags;
    *(undefined1 *)(puVar4 + 3) = 1;
    *(byte *)((long)puVar4 + 0xd) = (byte)rmSize;
    *(byte *)((long)puVar4 + 0xe) = bVar14;
    *(byte *)((long)puVar4 + 0xf) = bVar15;
    puVar4[4] = useRegMask;
    puVar4[5] = outRegMask;
    puVar4[6] = useRewriteMask;
    puVar4[7] = outRewriteMask;
    *(undefined4 **)(workReg + 0x10) = puVar4;
    *(undefined4 *)(workReg + 0x28) = *(undefined4 *)this;
    if (3 < bVar16) goto LAB_00137824;
    if (this[(ulong)uVar8 + 0x10] != (RAInstBuilder)0xff) {
      *(int *)(this + 0x10) = *(int *)(this + 0x10) + (1 << (bVar16 * '\b' & 0x1f));
      return 0;
    }
  }
  else {
    pcStack_40 = (code *)0x137824;
    add();
LAB_00137824:
    pcStack_40 = (code *)0x137829;
    add();
  }
  pcStack_40 = addCallArg;
  add();
  if (extraout_EDX == 0xff) {
    uStack_48 = 0x13792c;
    addCallArg();
LAB_0013792c:
    uStack_48 = 0x137931;
    addCallArg();
LAB_00137931:
    uStack_48 = 0x137936;
    addCallArg();
  }
  else {
    uVar8 = *(uint *)(workReg + 0x20);
    uVar21 = uVar8 >> 8 & 0xf;
    bVar16 = (byte)extraout_EDX;
    uVar22 = 1 << (bVar16 & 0x1f);
    ppBVar1 = &(((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._cc;
    *(uint *)ppBVar1 = *(uint *)ppBVar1 | 0x45;
    if (3 < (byte)uVar21) goto LAB_0013792c;
    pAVar2 = &(((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
              _formatOptions._indentation + ((ulong)uVar21 - 0x11);
    *(uint *)pAVar2->_data = *(uint *)pAVar2->_data | uVar22;
    puVar19 = (uint *)((long)&(((RACFGBuilder *)this)->
                              super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._curBlock + 4);
    *puVar19 = *puVar19 | 0x101 << ((byte)(uVar8 >> 8) & 0xf);
    lVar18 = *(long *)(workReg + 0x10);
    if (lVar18 != 0) {
      if (*(char *)(lVar18 + 0xe) == -1) {
        *(byte *)(lVar18 + 0xe) = bVar16;
        *(uint *)(lVar18 + 0x10) = *(uint *)(lVar18 + 0x10) & uVar22;
        uVar8 = 0x45;
      }
      else {
        *(uint *)(lVar18 + 0x10) = *(uint *)(lVar18 + 0x10) | uVar22;
        uVar8 = 0x10045;
      }
      *(char *)(lVar18 + 0xc) = *(char *)(lVar18 + 0xc) + '\x01';
      *(uint *)(lVar18 + 8) = *(uint *)(lVar18 + 8) | uVar8;
      return 0;
    }
    puVar4 = *(undefined4 **)
              &(((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
               field_0x38;
    if (((long)puVar4 + (-0x40 - (long)this) & 0x1ffffff000U) != 0) goto LAB_00137931;
    *(undefined4 **)
     &(((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).field_0x38 =
         puVar4 + 8;
    *puVar4 = *(undefined4 *)workReg;
    *(undefined8 *)(puVar4 + 1) = 0x45ffffffff;
    *(undefined2 *)(puVar4 + 3) = 1;
    *(byte *)((long)puVar4 + 0xe) = bVar16;
    *(undefined1 *)((long)puVar4 + 0xf) = 0xff;
    puVar4[4] = uVar22;
    puVar4[5] = uVar22;
    *(undefined8 *)(puVar4 + 6) = 0;
    *(undefined4 **)(workReg + 0x10) = puVar4;
    *(undefined4 *)(workReg + 0x28) =
         *(undefined4 *)
          &(((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass;
    if (*(char *)((long)(&(((RACFGBuilder *)this)->
                          super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._formatOptions + -6
                        ) + (ulong)uVar21) != -1) {
      ppRVar24 = &(((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                  _curBlock;
      *(int *)ppRVar24 = *(int *)ppRVar24 + (1 << ((byte)uVar21 * '\b' & 0x1f));
      return 0;
    }
  }
  uStack_48 = 0x13793b;
  addCallArg();
  if (extraout_EDX_00 == 0xff) {
    pcStack_50 = (code *)0x137a2f;
    addCallRet();
LAB_00137a2f:
    pcStack_50 = (code *)0x137a34;
    addCallRet();
  }
  else {
    uVar8 = *(uint *)(workReg + 0x20);
    uVar21 = uVar8 >> 8 & 0xf;
    bVar16 = (byte)extraout_EDX_00;
    uVar22 = 1 << (bVar16 & 0x1f);
    ppBVar1 = &(((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._cc;
    *(uint *)ppBVar1 = *(uint *)ppBVar1 | 0x8a;
    if (3 < (byte)uVar21) goto LAB_00137a2f;
    pAVar2 = &(((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
              _formatOptions._indentation + ((ulong)uVar21 - 0x11);
    *(uint *)pAVar2->_data = *(uint *)pAVar2->_data | uVar22;
    puVar19 = (uint *)((long)&(((RACFGBuilder *)this)->
                              super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._curBlock + 4);
    *puVar19 = *puVar19 | 0x101 << ((byte)(uVar8 >> 8) & 0xf);
    lVar18 = *(long *)(workReg + 0x10);
    if (lVar18 != 0) {
      if (*(char *)(lVar18 + 0xf) == -1) {
        *(char *)(lVar18 + 0xc) = *(char *)(lVar18 + 0xc) + '\x01';
        *(byte *)(lVar18 + 8) = *(byte *)(lVar18 + 8) | 0x8a;
        *(byte *)(lVar18 + 0xf) = bVar16;
        return 0;
      }
      return 0x41;
    }
    puVar4 = *(undefined4 **)
              &(((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
               field_0x38;
    if (((long)puVar4 + (-0x40 - (long)this) & 0x1ffffff000U) == 0) {
      *(undefined4 **)
       &(((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).field_0x38 =
           puVar4 + 8;
      *puVar4 = *(undefined4 *)workReg;
      *(undefined8 *)(puVar4 + 1) = 0x8affffffff;
      *(undefined2 *)(puVar4 + 3) = 1;
      *(undefined1 *)((long)puVar4 + 0xe) = 0xff;
      *(byte *)((long)puVar4 + 0xf) = bVar16;
      puVar4[4] = 0xffffffff;
      puVar4[5] = uVar22;
      *(undefined8 *)(puVar4 + 6) = 0;
      *(undefined4 **)(workReg + 0x10) = puVar4;
      *(undefined4 *)(workReg + 0x28) =
           *(undefined4 *)
            &(((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass;
      if (*(char *)((long)(&(((RACFGBuilder *)this)->
                            super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._formatOptions +
                          -6) + (ulong)uVar21) != -1) {
        ppRVar24 = &(((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                    _curBlock;
        *(int *)ppRVar24 = *(int *)ppRVar24 + (1 << ((byte)uVar21 * '\b' & 0x1f));
        return 0;
      }
      goto LAB_00137a39;
    }
  }
  pcStack_50 = (code *)0x137a39;
  addCallRet();
LAB_00137a39:
  pcStack_50 = RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::run;
  addCallRet();
  uStack_60 = 0x1ffffff000;
  pLVar12 = (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._logger;
  uStack_78 = (ulong)useRegMask;
  uStack_70 = (ulong)outRegMask;
  uStack_68 = (ulong)consecutiveParent;
  uStack_58 = (ulong)uVar25;
  pcStack_50 = (code *)(ulong)rmSize;
  if (pLVar12 != (Logger *)0x0) {
    Logger::logf(pLVar12,__x);
  }
  EVar9 = RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::prepare
                    ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)this);
  if (EVar9 == 0) {
    if (((((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._logger !=
         (Logger *)0x0) &&
       (RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::_logNode
                  ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)this,
                   (BaseNode *)
                   (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                   _funcNode,2,(char *)0x0),
       (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._logger !=
       (Logger *)0x0)) {
      RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::_logBlock
                ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)this,
                 (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                 _curBlock,2);
    }
    ppRVar24 = &(((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                _curBlock;
    pFVar5 = (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
             _funcNode;
    invokeNode = *(InvokeNode **)&pFVar5->field_0x8;
    if (invokeNode != (InvokeNode *)0x0) {
      pRStack_10c0 = (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)
                     ._curBlock;
      *(FuncNode **)(pRStack_10c0 + 0x10) = pFVar5;
      *(FuncNode **)(pRStack_10c0 + 0x18) = pFVar5;
      uStack_10b8 = 0xffffffff;
      puStack_1080 = auStack_1078;
      uStack_10b4 = 0;
      uStack_10ac = 0;
      uStack_10a4 = 0;
      uStack_109c = 0;
      uStack_1094 = 0;
      uStack_108c = 0;
      uStack_1084 = 0;
      lStack_10e0 = 0;
      uStack_10d8 = 0;
      ppRStack_10f0 = ppRVar24;
LAB_00137b21:
      do {
        iVar3 = *(int *)&invokeNode->field_0x14;
        if (1 < iVar3 + 1U) {
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/arm/../arm/../core/rabuilders_p.h"
                     ,0x60,"node->position() == 0 || node->position() == kNodePositionDidOnBefore");
        }
        initialNode = *(InvokeNode **)&invokeNode->field_0x8;
        if ((invokeNode->field_0x11 & 0x20) == 0) {
          cVar7 = invokeNode->field_0x10;
          if (cVar7 == '\x03') {
            pRVar10 = *ppRVar24;
            pRVar11 = *(RABlock **)&invokeNode->field_0x20;
            if (pRVar10 == (RABlock *)0x0) {
              *ppRVar24 = pRVar11;
              if (pRVar11 == (RABlock *)0x0) {
                pRVar11 = BaseRAPass::newBlock
                                    ((((RACFGBuilder *)this)->
                                     super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass,
                                     (BaseNode *)invokeNode);
                (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                _curBlock = pRVar11;
                if (pRVar11 == (RABlock *)0x0) {
                  return 1;
                }
                *(RABlock **)&invokeNode->field_0x20 = pRVar11;
                uVar8 = *(uint *)(pRVar11 + 0xc);
              }
              else {
                uVar8 = *(uint *)(pRVar11 + 0xc);
                if ((uVar8 & 1) != 0) goto LAB_00138265;
              }
              *(uint *)(pRVar11 + 0xc) = uVar8 | 4;
              (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
              _hasCode = false;
              (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
              _blockRegStats._packed = 0;
              EVar9 = BaseRAPass::addBlock
                                ((((RACFGBuilder *)this)->
                                 super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass,
                                 pRVar11);
              if (EVar9 != 0) {
                return EVar9;
              }
              pRVar11 = *ppRStack_10f0;
            }
            else if (pRVar11 == (RABlock *)0x0) {
              if ((pRVar10 == pRStack_10c0 |
                  (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                  _hasCode) == 1) {
                if (*(InvokeNode **)(pRVar10 + 0x18) == invokeNode) goto LAB_001382fe;
                *(undefined8 *)(pRVar10 + 0x18) = *(undefined8 *)invokeNode;
                *(uint *)(pRVar10 + 0xc) = *(uint *)(pRVar10 + 0xc) | 0x201;
                *(uint *)(pRVar10 + 0x30) =
                     *(uint *)(pRVar10 + 0x30) |
                     (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)
                     ._blockRegStats._packed;
                pRVar10 = BaseRAPass::newBlock
                                    ((((RACFGBuilder *)this)->
                                     super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass,
                                     (BaseNode *)invokeNode);
                if (pRVar10 == (RABlock *)0x0) {
                  return 1;
                }
                pRVar10[0xc] = (RABlock)((byte)pRVar10[0xc] | 4);
                EVar9 = RABlock::appendSuccessor(*ppRStack_10f0,pRVar10);
                if (EVar9 != 0) {
                  return EVar9;
                }
                EVar9 = BaseRAPass::addBlock
                                  ((((RACFGBuilder *)this)->
                                   super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass,
                                   pRVar10);
                if (EVar9 != 0) {
                  return EVar9;
                }
                (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                _curBlock = pRVar10;
                (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                _hasCode = false;
                (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                _blockRegStats._packed = 0;
              }
              *(RABlock **)&invokeNode->field_0x20 = pRVar10;
              pRVar11 = pRVar10;
            }
            else {
              pRVar11[0xc] = (RABlock)((byte)pRVar11[0xc] | 4);
              if (pRVar10 == pRVar11) {
                pRVar11 = pRVar10;
                if ((((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                    _hasCode != false) break;
              }
              else {
                if (*(InvokeNode **)(pRVar10 + 0x18) == invokeNode) {
LAB_001382f9:
                  RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::run();
LAB_001382fe:
                  RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::run();
                  __clang_call_terminate(extraout_RAX);
                }
                *(undefined8 *)(pRVar10 + 0x18) = *(undefined8 *)invokeNode;
                *(uint *)(pRVar10 + 0xc) = *(uint *)(pRVar10 + 0xc) | 0x201;
                *(uint *)(pRVar10 + 0x30) =
                     *(uint *)(pRVar10 + 0x30) |
                     (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)
                     ._blockRegStats._packed;
                EVar9 = RABlock::appendSuccessor(pRVar10,pRVar11);
                if (EVar9 != 0) {
                  return EVar9;
                }
                EVar9 = BaseRAPass::addBlock
                                  ((((RACFGBuilder *)this)->
                                   super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass,
                                   pRVar11);
                if (EVar9 != 0) {
                  return EVar9;
                }
                (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                _curBlock = pRVar11;
                (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                _hasCode = false;
                (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                _blockRegStats._packed = 0;
              }
            }
            ppRVar24 = ppRStack_10f0;
            pLVar12 = (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>
                      )._logger;
            if ((pRVar11 == (RABlock *)0x0) ||
               (pRVar11 ==
                (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                _lastLoggedBlock)) {
LAB_00138123:
              if (pLVar12 != (Logger *)0x0) {
                RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::_logNode
                          ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)this,
                           (BaseNode *)invokeNode,2,(char *)0x0);
              }
            }
            else if (pLVar12 != (Logger *)0x0) {
              RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::_logBlock
                        ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)this,pRVar11,2);
              pLVar12 = (((RACFGBuilder *)this)->
                        super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._logger;
              goto LAB_00138123;
            }
            if (*(uint32_t *)&invokeNode->field_0x30 ==
                (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                _exitLabelId) {
              pRVar10 = (((RACFGBuilder *)this)->
                        super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._curBlock;
              *(InvokeNode **)(pRVar10 + 0x18) = invokeNode;
              pRVar10[0xc] = (RABlock)((byte)pRVar10[0xc] | 1);
              *(uint *)(pRVar10 + 0x30) =
                   *(uint *)(pRVar10 + 0x30) |
                   (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                   _blockRegStats._packed;
              EVar9 = BaseRAPass::addExitBlock
                                ((((RACFGBuilder *)this)->
                                 super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass,
                                 pRVar10);
LAB_00137ee1:
              if (EVar9 != 0) {
                return EVar9;
              }
              goto LAB_00138184;
            }
          }
          else {
            if ((((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                _logger != (Logger *)0x0) {
              RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::_logNode
                        ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)this,
                         (BaseNode *)invokeNode,4,(char *)0x0);
              cVar7 = invokeNode->field_0x10;
            }
            if (cVar7 == '\n') {
              if (invokeNode ==
                  (InvokeNode *)
                  ((((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                  _funcNode)->_end) {
                if (((((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)
                     ._curBlock == (RABlock *)0x0) ||
                   (((((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)
                     ._hasCode & 1U) == 0)) goto LAB_00138265;
                break;
              }
            }
            else if ((cVar7 == '\x10') &&
                    (invokeNode !=
                     (InvokeNode *)
                     (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)
                     ._funcNode)) break;
          }
        }
        else {
          if (*ppRVar24 == (RABlock *)0x0) {
            RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::removeNode
                      ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)this,
                       (BaseNode *)invokeNode);
            invokeNode = initialNode;
            goto LAB_00137b21;
          }
          (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._hasCode =
               true;
          if (invokeNode->field_0x10 == '\x11') {
            if (iVar3 != -1) goto LAB_00137c8a;
LAB_00137ca7:
            *(undefined4 *)&invokeNode->field_0x14 = 0;
          }
          else if (invokeNode->field_0x10 == '\x12') {
            if (iVar3 == -1) goto LAB_00137ca7;
            lVar18 = *(long *)invokeNode;
            EVar9 = a64::RACFGBuilder::onBeforeInvoke((RACFGBuilder *)this,invokeNode);
            if (EVar9 != 0) {
              return EVar9;
            }
            if (lVar18 != *(long *)invokeNode) {
              if (*(InvokeNode **)(*ppRVar24 + 0x10) == invokeNode) {
                *(undefined8 *)(*ppRVar24 + 0x10) = *(undefined8 *)(lVar18 + 8);
              }
              *(undefined4 *)&invokeNode->field_0x14 = 0xffffffff;
              invokeNode = *(InvokeNode **)(lVar18 + 8);
              if ((invokeNode->field_0x11 & 0x20) == 0) {
                RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::run();
                goto LAB_001382f9;
              }
            }
LAB_00137c8a:
            initialNode = *(InvokeNode **)&invokeNode->field_0x8;
          }
          if ((((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
              _logger != (Logger *)0x0) {
            RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::_logNode
                      ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)this,
                       (BaseNode *)invokeNode,4,(char *)0x0);
          }
          IStack_10f4 = kRegular;
          uStack_10b8 = *(undefined4 *)
                         ((((RACFGBuilder *)this)->
                          super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._curBlock + 8);
          uStack_1084 = 0;
          uStack_1094 = 0;
          uStack_108c = 0;
          uStack_10a4 = 0;
          uStack_109c = 0;
          uStack_10b4 = 0;
          uStack_10ac = 0;
          puStack_1080 = auStack_1078;
          EVar9 = a64::RACFGBuilder::onInst
                            ((RACFGBuilder *)this,(InstNode *)invokeNode,&IStack_10f4,
                             (RAInstBuilder *)&uStack_10b8);
          if (EVar9 != 0) {
            return EVar9;
          }
          cVar7 = invokeNode->field_0x10;
          if (cVar7 == '\x12') {
            EVar9 = a64::RACFGBuilder::onInvoke
                              ((RACFGBuilder *)this,invokeNode,(RAInstBuilder *)&uStack_10b8);
            if (EVar9 != 0) {
              return EVar9;
            }
            cVar7 = invokeNode->field_0x10;
          }
          if (cVar7 == '\x11') {
            EVar9 = a64::RACFGBuilder::onRet
                              ((RACFGBuilder *)this,(FuncRetNode *)invokeNode,
                               (RAInstBuilder *)&uStack_10b8);
            if (EVar9 != 0) {
              return EVar9;
            }
            IStack_10f4 = kMaxValue;
          }
          else if ((IStack_10f4 == kJump) && (auStack_1078 != puStack_1080)) {
            pBVar20 = (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>
                      )._pass;
            uVar8 = 0;
            puVar19 = auStack_1078;
            do {
              if (*(uint *)&pBVar20->field_0x148 <= *puVar19) {
                RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::run();
                goto LAB_001382c3;
              }
              if ((*(byte *)(*(long *)(*(long *)&pBVar20->_workRegs + (ulong)*puVar19 * 8) + 0x21) &
                  0xf) == 0) {
                bVar16 = *(byte *)((long)puVar19 + 0xe);
                if (bVar16 == 0xff) {
                  if (1 < uVar8) {
                    RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::run();
                    return 1;
                  }
                  uVar17 = (ulong)uVar8;
                  uVar8 = uVar8 + 1;
                  bVar16 = (pBVar20->_scratchRegIndexes)._data[uVar17];
                  *(byte *)((long)puVar19 + 0xe) = bVar16;
                }
                *(uint *)(*ppRVar24 + 0xc0) = *(uint *)(*ppRVar24 + 0xc0) | 1 << (bVar16 & 0x1f);
              }
              puVar19 = puVar19 + 8;
            } while (puVar19 != puStack_1080);
          }
          EVar9 = BaseRAPass::assignRAInst
                            ((((RACFGBuilder *)this)->
                             super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass,
                             (BaseNode *)invokeNode,
                             (((RACFGBuilder *)this)->
                             super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._curBlock,
                             (RAInstBuilder *)&uStack_10b8);
          IVar6 = IStack_10f4;
          if (EVar9 != 0) {
            return EVar9;
          }
          uVar8 = (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                  _blockRegStats._packed | (uint)uStack_10a4;
          (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
          _blockRegStats._packed = uVar8;
          if (IStack_10f4 == kRegular) goto LAB_0013818b;
          if (kBranch < IStack_10f4) {
            if (IStack_10f4 != kMaxValue) goto LAB_0013818b;
            pRVar10 = (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>
                      )._curBlock;
            *(InvokeNode **)(pRVar10 + 0x18) = invokeNode;
            pRVar10[0xc] = (RABlock)((byte)pRVar10[0xc] | 1);
            *(uint *)(pRVar10 + 0x30) = *(uint *)(pRVar10 + 0x30) | uVar8;
            EVar9 = RABlock::appendSuccessor
                              (pRVar10,(((RACFGBuilder *)this)->
                                       super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                                       _retBlock);
            goto LAB_00137ee1;
          }
          pRVar10 = *ppRVar24;
          *(InvokeNode **)(pRVar10 + 0x18) = invokeNode;
          uVar25 = *(uint *)(pRVar10 + 0xc);
          *(uint *)(pRVar10 + 0xc) = uVar25 | 0x101;
          *(uint *)(pRVar10 + 0x30) = *(uint *)(pRVar10 + 0x30) | uVar8;
          if ((invokeNode->field_0x34 & 2) == 0) {
            if (invokeNode->field_0x12 == 0) break;
            lVar18 = (ulong)((byte)invokeNode->field_0x12 - 1) * 0x10;
            if ((*(uint *)(&invokeNode->field_0x40 + lVar18) & 7) == 5) {
              EVar9 = BaseBuilder::labelNodeOf
                                (&((((RACFGBuilder *)this)->
                                   super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._cc)->
                                  super_BaseBuilder,&pLStack_10e8,
                                 *(uint32_t *)(&invokeNode->field_0x44 + lVar18));
              if (EVar9 != 0) {
                return EVar9;
              }
              pRVar10 = BaseRAPass::newBlockOrExistingAt
                                  ((((RACFGBuilder *)this)->
                                   super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass,
                                   pLStack_10e8,(BaseNode **)0x0);
              if (pRVar10 == (RABlock *)0x0) {
                return 1;
              }
              pRVar10[0xc] = (RABlock)((byte)pRVar10[0xc] | 4);
              EVar9 = RABlock::appendSuccessor(*ppRVar24,pRVar10);
            }
            else {
              *(uint *)(pRVar10 + 0xc) = uVar25 | 0x501;
              if ((invokeNode->field_0x10 == '\x0f') &&
                 (lVar18 = *(long *)&invokeNode->_funcDetail, lVar18 != 0)) {
                pBVar20 = (((RACFGBuilder *)this)->
                          super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass;
                uVar26 = pBVar20->_lastTimestamp + 1;
                pBVar20->_lastTimestamp = uVar26;
                uVar8 = *(uint *)(lVar18 + 0x18);
                if ((ulong)uVar8 != 0) {
                  lStack_10c8 = *(long *)(lVar18 + 0x10);
                  lVar18 = 0;
                  do {
                    EVar9 = BaseBuilder::labelNodeOf
                                      (&((((RACFGBuilder *)this)->
                                         super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._cc)
                                        ->super_BaseBuilder,&pLStack_10e8,
                                       *(uint32_t *)(lStack_10c8 + lVar18));
                    if (EVar9 != 0) {
                      return EVar9;
                    }
                    pRVar10 = BaseRAPass::newBlockOrExistingAt
                                        ((((RACFGBuilder *)this)->
                                         super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                                         _pass,pLStack_10e8,(BaseNode **)0x0);
                    if (pRVar10 == (RABlock *)0x0) {
                      return 1;
                    }
                    if (*(uint64_t *)(pRVar10 + 0x48) != uVar26) {
                      *(uint64_t *)(pRVar10 + 0x48) = uVar26;
                      pRVar10[0xc] = (RABlock)((byte)pRVar10[0xc] | 4);
                      EVar9 = RABlock::appendSuccessor(*ppRStack_10f0,pRVar10);
                      if (EVar9 != 0) {
                        return EVar9;
                      }
                    }
                    lVar18 = lVar18 + 4;
                  } while ((ulong)uVar8 << 2 != lVar18);
                  pRVar10 = *ppRStack_10f0;
                  ppRVar24 = ppRStack_10f0;
                }
                EVar9 = RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::
                        shareAssignmentAcrossSuccessors
                                  ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)this,pRVar10);
              }
              else {
                EVar9 = ZoneVector<asmjit::v1_14::RABlock_*>::append
                                  ((ZoneVector<asmjit::v1_14::RABlock_*> *)&lStack_10e0,
                                   &((((RACFGBuilder *)this)->
                                     super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass)->
                                    _allocator,ppRVar24);
              }
            }
            if (EVar9 != 0) {
              return EVar9;
            }
          }
          if (IVar6 != kJump) {
            if (initialNode == (InvokeNode *)0x0) break;
            if (initialNode->field_0x10 == '\x03') {
              pRVar10 = *(RABlock **)&initialNode->field_0x20;
              if (pRVar10 == (RABlock *)0x0) {
                pRVar10 = BaseRAPass::newBlock
                                    ((((RACFGBuilder *)this)->
                                     super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass,
                                     (BaseNode *)initialNode);
                if (pRVar10 == (RABlock *)0x0) {
                  return 1;
                }
                *(RABlock **)&initialNode->field_0x20 = pRVar10;
              }
            }
            else {
              pRVar10 = BaseRAPass::newBlock
                                  ((((RACFGBuilder *)this)->
                                   super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass,
                                   (BaseNode *)initialNode);
              if (pRVar10 == (RABlock *)0x0) {
                return 1;
              }
            }
            this_00 = *ppRVar24;
            pRVar11 = this_00 + 0xc;
            *(uint *)pRVar11 = *(uint *)pRVar11 | 0x200;
            EVar9 = RABlock::prependSuccessor(this_00,pRVar10);
            if (EVar9 != 0) {
              return EVar9;
            }
            (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
            _curBlock = pRVar10;
            (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._hasCode
                 = false;
            (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
            _blockRegStats._packed = 0;
            if (((byte)pRVar10[0xc] & 1) != 0) {
LAB_00138265:
              lVar18 = lStack_10e0;
              pBVar20 = (((RACFGBuilder *)this)->
                        super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass;
              if (pBVar20->_createdBlockCount == *(uint32_t *)&pBVar20->field_0xb8) {
                uVar17 = uStack_10d8 & 0xffffffff;
                if (uVar17 != 0) {
                  lVar23 = 0;
                  do {
                    RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::handleBlockWithUnknownJump
                              ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)this,
                               *(RABlock **)(lVar18 + lVar23));
                    lVar23 = lVar23 + 8;
                  } while (uVar17 << 3 != lVar23);
                  pBVar20 = (((RACFGBuilder *)this)->
                            super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass;
                }
                EVar9 = BaseRAPass::initSharedAssignments
                                  (pBVar20,&(((RACFGBuilder *)this)->
                                            super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                                            _sharedAssignmentsMap);
                return EVar9;
              }
              return 3;
            }
            EVar9 = BaseRAPass::addBlock
                              ((((RACFGBuilder *)this)->
                               super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass,pRVar10)
            ;
            if (EVar9 != 0) {
              return EVar9;
            }
            invokeNode = initialNode;
            if ((((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                _logger != (Logger *)0x0) {
              RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::_logBlock
                        ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)this,
                         (((RACFGBuilder *)this)->
                         super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._curBlock,2);
            }
            goto LAB_00137b21;
          }
LAB_00138184:
          *ppRVar24 = (RABlock *)0x0;
        }
LAB_0013818b:
        invokeNode = initialNode;
      } while (initialNode != (InvokeNode *)0x0);
    }
LAB_001382c3:
    EVar9 = 3;
  }
  return EVar9;
}

Assistant:

Error add(
    RAWorkReg* workReg,
    RATiedFlags flags,
    RegMask useRegMask, uint32_t useId, uint32_t useRewriteMask,
    RegMask outRegMask, uint32_t outId, uint32_t outRewriteMask,
    uint32_t rmSize = 0,
    uint32_t consecutiveParent = Globals::kInvalidId
  ) noexcept {
    RegGroup group = workReg->group();
    RATiedReg* tiedReg = workReg->tiedReg();

    if (useId != BaseReg::kIdBad) {
      _stats.makeFixed(group);
      _used[group] |= Support::bitMask(useId);
      flags |= RATiedFlags::kUseFixed;
    }

    if (outId != BaseReg::kIdBad) {
      _clobbered[group] |= Support::bitMask(outId);
      flags |= RATiedFlags::kOutFixed;
    }

    _aggregatedFlags |= flags;
    _stats.makeUsed(group);

    if (!tiedReg) {
      // Would happen when the builder is not reset properly after each instruction - so catch that!
      ASMJIT_ASSERT(tiedRegCount() < ASMJIT_ARRAY_SIZE(_tiedRegs));

      tiedReg = _cur++;
      tiedReg->init(workReg->workId(), flags, useRegMask, useId, useRewriteMask, outRegMask, outId, outRewriteMask, rmSize, consecutiveParent);

      workReg->setTiedReg(tiedReg);
      workReg->assignBasicBlock(_basicBlockId);

      _count.add(group);
      return kErrorOk;
    }
    else {
      if (consecutiveParent != tiedReg->consecutiveParent()) {
        if (tiedReg->consecutiveParent() != Globals::kInvalidId)
          return DebugUtils::errored(kErrorInvalidState);
        tiedReg->_consecutiveParent = consecutiveParent;
      }

      if (useId != BaseReg::kIdBad) {
        if (ASMJIT_UNLIKELY(tiedReg->hasUseId()))
          return DebugUtils::errored(kErrorOverlappedRegs);
        tiedReg->setUseId(useId);
      }

      if (outId != BaseReg::kIdBad) {
        if (ASMJIT_UNLIKELY(tiedReg->hasOutId()))
          return DebugUtils::errored(kErrorOverlappedRegs);
        tiedReg->setOutId(outId);
      }

      tiedReg->addRefCount();
      tiedReg->addFlags(flags);
      tiedReg->_useRegMask &= useRegMask;
      tiedReg->_useRewriteMask |= useRewriteMask;
      tiedReg->_outRegMask &= outRegMask;
      tiedReg->_outRewriteMask |= outRewriteMask;
      tiedReg->_rmSize = uint8_t(Support::max<uint32_t>(tiedReg->rmSize(), rmSize));
      return kErrorOk;
    }
  }